

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O1

void __thiscall
binlog::PrettyPrinter::printTimeField
          (PrettyPrinter *this,OstreamBuffer *out,char spec,BrokenDownTime *bdt,int tzoffset,
          char *tzname)

{
  int iVar1;
  char cVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  size_t __n;
  undefined7 in_register_00000011;
  void *pvVar6;
  ulong uVar7;
  uint uVar8;
  char digits [2];
  char local_38;
  byte local_37;
  
  iVar5 = (int)CONCAT71(in_register_00000011,spec);
  if (iVar5 < 0x5a) {
    if (iVar5 < 0x4e) {
      if (iVar5 == 0x48) {
        lVar4 = (long)(bdt->super_tm).tm_hour;
      }
      else {
        if (iVar5 != 0x4d) goto LAB_00108c60;
        lVar4 = (long)(bdt->super_tm).tm_min;
      }
    }
    else {
      if (iVar5 == 0x4e) {
        __n = (size_t)(uint)bdt->tm_nsec;
        snprintf(&local_38,0x10,"%.9d");
        pvVar6 = (void *)0x9;
        goto LAB_00108c4e;
      }
      if (iVar5 != 0x53) {
        if (iVar5 == 0x59) {
          detail::OstreamBuffer::writeSigned(out,(long)(bdt->super_tm).tm_year + 0x76c);
          return;
        }
LAB_00108c60:
        detail::OstreamBuffer::put(out,'%');
        detail::OstreamBuffer::put(out,spec);
        return;
      }
      lVar4 = (long)(bdt->super_tm).tm_sec;
    }
LAB_00108c1d:
    iVar5 = (int)((ulong)(lVar4 * 0x66666667) >> 0x20);
    iVar5 = (iVar5 >> 2) - (iVar5 >> 0x1f);
    cVar2 = (char)iVar5;
    local_38 = cVar2 + '0';
    __n = (size_t)CONCAT31((int3)((uint)iVar5 >> 8),local_38);
    local_37 = (char)lVar4 + cVar2 * -10 + '0';
  }
  else {
    if (iVar5 < 0x6d) {
      if (iVar5 == 0x5a) {
        pvVar6 = (void *)strlen(tzname);
        detail::OstreamBuffer::write(out,(int)tzname,pvVar6,(size_t)bdt);
        return;
      }
      if (iVar5 != 100) goto LAB_00108c60;
      lVar4 = (long)(bdt->super_tm).tm_mday;
      goto LAB_00108c1d;
    }
    if (iVar5 == 0x6d) {
      iVar5 = (bdt->super_tm).tm_mon;
      iVar1 = (iVar5 + 1) / 10;
      cVar2 = (char)iVar1;
      local_38 = cVar2 + '0';
      __n = (size_t)CONCAT31((int3)((uint)iVar1 >> 8),local_38);
      local_37 = (char)iVar5 + cVar2 * -10 + '1';
    }
    else {
      if (iVar5 == 0x79) {
        lVar4 = (long)((bdt->super_tm).tm_year % 100);
        goto LAB_00108c1d;
      }
      if (iVar5 != 0x7a) goto LAB_00108c60;
      uVar7 = (ulong)(uint)-tzoffset;
      if (0 < tzoffset) {
        uVar7 = (ulong)(uint)tzoffset;
      }
      uVar8 = (uint)(uVar7 / 0xe10);
      iVar5 = uVar8 * -0x3c + (int)(uVar7 / 0x3c);
      detail::OstreamBuffer::put(out,(char)(tzoffset >> 0x1f) * -2 + '+');
      if (359999 < (uint)uVar7) {
        uVar8 = 0;
      }
      uVar3 = (uVar8 / 10) * 10;
      local_38 = (char)((ulong)uVar8 * 0x1999999a >> 0x20) + '0';
      local_37 = (char)uVar8 - (char)uVar3 | 0x30;
      detail::OstreamBuffer::write(out,(int)&local_38,(void *)0x2,(ulong)uVar3);
      if (99 < iVar5) {
        iVar5 = 0;
      }
      cVar2 = (char)(iVar5 / 10);
      local_38 = cVar2 + '0';
      __n = (size_t)CONCAT31((int3)((uint)(iVar5 / 10) >> 8),local_38);
      local_37 = (char)iVar5 + cVar2 * -10 + '0';
    }
  }
  pvVar6 = (void *)0x2;
LAB_00108c4e:
  detail::OstreamBuffer::write(out,(int)&local_38,pvVar6,__n);
  return;
}

Assistant:

void PrettyPrinter::printTimeField(detail::OstreamBuffer& out, char spec, BrokenDownTime& bdt, int tzoffset, const char* tzname) const
{
  switch (spec)
  {
  case 'Y':
    out << bdt.tm_year + 1900;
    break;
  case 'y':
    printTwoDigits(out, bdt.tm_year % 100);
    break;
  case 'm':
    printTwoDigits(out, bdt.tm_mon + 1);
    break;
  case 'd':
    printTwoDigits(out, bdt.tm_mday);
    break;
  case 'H':
    printTwoDigits(out, bdt.tm_hour);
    break;
  case 'M':
    printTwoDigits(out, bdt.tm_min);
    break;
  case 'S':
    printTwoDigits(out, bdt.tm_sec);
    break;
  case 'z':
    printTimeZoneOffset(out, tzoffset);
    break;
  case 'Z':
    out << tzname;
    break;
  case 'N':
    printNineDigits(out, bdt.tm_nsec);
    break;
  default:
    out << '%' << spec;
    break;
  }
}